

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::InterpolateAtOffsetCase::init
          (InterpolateAtOffsetCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  ContextInfo *this_00;
  RenderContext *pRVar3;
  NotSupportedError *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar4;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_1a8;
  deUint32 local_18;
  ContextType local_14;
  InterpolateAtOffsetCase *local_10;
  InterpolateAtOffsetCase *this_local;
  
  local_10 = this;
  this_00 = gles31::Context::getContextInfo
                      ((this->super_MultisampleRenderCase).super_TestCase.m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_shader_multisample_interpolation");
  if (!bVar1) {
    pRVar3 = gles31::Context::getRenderContext
                       ((this->super_MultisampleRenderCase).super_TestCase.m_context);
    local_14.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    local_18 = (deUint32)glu::ApiType::es(3,2);
    bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Test requires GL_OES_shader_multisample_interpolation extension",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderMultisampleInterpolationTests.cpp"
                 ,0x4cf);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_02 = tcu::TestContext::getLog
                      ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_1a8,
                      (char (*) [60])"Verifying that interpolateAtOffset returns correct values.\n")
  ;
  pMVar4 = tcu::MessageBuilder::operator<<
                     (pMVar4,(char (*) [56])
                             "\tInterpolate varying containing screen space location.\n");
  pMVar4 = tcu::MessageBuilder::operator<<
                     (pMVar4,(char (*) [96])
                             "\t=> interpolateAtOffset(varying, offset) should be \"varying value at the pixel center\" + offset"
                     );
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  iVar2 = MultisampleShaderRenderUtil::MultisampleRenderCase::init
                    (&this->super_MultisampleRenderCase,ctx_00);
  return iVar2;
}

Assistant:

void InterpolateAtOffsetCase::init (void)
{
	// requirements
	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_multisample_interpolation") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		TCU_THROW(NotSupportedError, "Test requires GL_OES_shader_multisample_interpolation extension");

	// test purpose and expectations
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that interpolateAtOffset returns correct values.\n"
		<< "	Interpolate varying containing screen space location.\n"
		<< "	=> interpolateAtOffset(varying, offset) should be \"varying value at the pixel center\" + offset"
		<< tcu::TestLog::EndMessage;

	MultisampleShaderRenderUtil::MultisampleRenderCase::init();
}